

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

bool __thiscall TCLAP::Arg::operator==(Arg *this,Arg *a)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = std::operator!=(&this->_flag,"");
  if (bVar1) {
    _Var2 = std::operator==(&this->_flag,&a->_flag);
    if (_Var2) {
      return true;
    }
  }
  _Var2 = std::operator==(&this->_name,&a->_name);
  return _Var2;
}

Assistant:

inline bool Arg::operator==(const Arg& a) const
{
	if ( ( _flag != "" && _flag == a._flag ) || _name == a._name)
		return true;
	else
		return false;
}